

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::CreatePolicyScopeSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  PositionType PVar2;
  ReferenceType __src;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  byte bVar9;
  iterator it;
  SnapshotDataType in_stack_fffffffffffffe08;
  undefined8 local_f8 [24];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_38;
  PositionType local_30;
  undefined1 local_28 [8];
  PositionType pos;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  bVar9 = 0;
  local_38 = (originSnapshot->Position).Tree;
  local_30 = (originSnapshot->Position).Position;
  pos.Position = (PositionType)originSnapshot;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*
                    (&originSnapshot->Position);
  memcpy(local_f8,__src,0xc0);
  PVar2 = local_30;
  pcVar1 = local_38;
  puVar7 = local_f8;
  puVar8 = (undefined8 *)&stack0xfffffffffffffe08;
  for (lVar6 = 0x18; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  it.Position = PVar2;
  it.Tree = pcVar1;
  _local_28 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push
                        (&this->SnapshotData,it,in_stack_fffffffffffffe08);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pSVar3->SnapshotType = PolicyScopeType;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pSVar3->Keep = false;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_28;
  (pBVar4->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     ((iterator *)(pos.Position + 8));
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_28)
  ;
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = (pSVar3->Policies).Position;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_28);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreatePolicyScopeSnapshot(
  cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::PolicyScopeType;
  pos->Keep = false;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}